

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAiger.c
# Opt level: O3

void Gia_AigerWriteSimple(Gia_Man_t *pInit,char *pFileName)

{
  FILE *__s;
  Vec_Str_t *__ptr;
  
  if (pInit->vCos->nSize == pInit->nRegs) {
    puts("Gia_AigerWriteSimple(): AIG cannot be written because it has no POs.");
    return;
  }
  __s = fopen(pFileName,"wb");
  if (__s != (FILE *)0x0) {
    __ptr = Gia_AigerWriteIntoMemoryStr(pInit);
    fwrite(__ptr->pArray,1,(long)__ptr->nSize,__s);
    if (__ptr->pArray != (char *)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    fclose(__s);
    return;
  }
  fprintf(_stdout,"Gia_AigerWriteSimple(): Cannot open the output file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Gia_AigerWriteSimple( Gia_Man_t * pInit, char * pFileName )
{
    FILE * pFile;
    Vec_Str_t * vStr;
    if ( Gia_ManPoNum(pInit) == 0 )
    {
        printf( "Gia_AigerWriteSimple(): AIG cannot be written because it has no POs.\n" );
        return;
    }
    // start the output stream
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Gia_AigerWriteSimple(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }
    // write the buffer
    vStr = Gia_AigerWriteIntoMemoryStr( pInit );
    fwrite( Vec_StrArray(vStr), 1, Vec_StrSize(vStr), pFile );
    Vec_StrFree( vStr );
    fclose( pFile );
}